

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-save.c
# Opt level: O0

void emitf(savestate_t *state,char *fmt,...)

{
  char in_AL;
  size_t sVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  char *in_RSI;
  undefined8 *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  int i;
  int depth;
  size_t fmtlen;
  va_list ap;
  undefined1 auStack_e8 [16];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  int local_38;
  int local_34;
  undefined4 local_28;
  undefined4 local_24;
  undefined1 *local_20;
  undefined1 *local_18;
  char *local_10;
  undefined8 *local_8;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  local_10 = in_RSI;
  local_8 = in_RDI;
  if (*(int *)(in_RDI + 1) != 0) {
    local_34 = *(int *)((long)in_RDI + 0xc);
    for (local_38 = 0; local_38 < local_34; local_38 = local_38 + 1) {
      fprintf((FILE *)*local_8,"  ");
    }
  }
  local_20 = &stack0x00000008;
  local_24 = 0x30;
  local_28 = 0x10;
  local_18 = auStack_e8;
  vfprintf((FILE *)*local_8,local_10,&local_28);
  sVar1 = strlen(local_10);
  *(uint *)(local_8 + 1) = (uint)(local_10[sVar1 - 1] == '\n');
  return;
}

Assistant:

static void emitf(savestate_t *state, const char *fmt, ...)
{
  va_list ap;
  size_t  fmtlen;

  if (state->indent_is_due)
  {
    int depth;
    int i;

    depth = state->depth;
    for (i = 0; i < depth; i++)
    {
#ifdef ZT_DEBUG
      printf("  ");
#endif
      fprintf(state->f, "  ");
    }
  }

#ifdef ZT_DEBUG
  va_start(ap, fmt);
  vprintf(fmt, ap);
  va_end(ap);
#endif

  va_start(ap, fmt);
  vfprintf(state->f, fmt, ap);
  va_end(ap);

  fmtlen = strlen(fmt);
  state->indent_is_due = (fmt[fmtlen - 1] == '\n'); /* weak newline detection */
}